

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OpenTableAndIndices
              (Parse *pParse,Table *pTab,int op,u8 p5,int iBase,u8 *aToOpen,int *piDataCur,
              int *piIdxCur)

{
  int iDb_00;
  Vdbe *p;
  undefined1 in_CL;
  int iDb_01;
  int iVar1;
  undefined4 in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  Parse *in_R9;
  int iIdxCur;
  Vdbe *v;
  Index *pIdx;
  int iDataCur;
  int iDb;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb8;
  Index *pIdx_00;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  int local_4;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffe0);
  if (*(int *)(in_RSI + 0x54) == 0) {
    iDb_00 = sqlite3SchemaToIndex((sqlite3 *)*in_RDI,*(Schema **)(in_RSI + 0x70));
    p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (in_R8D < 0) {
      in_R8D = *(int *)((long)in_RDI + 0x34);
    }
    iDb_01 = in_R8D + 1;
    if (v != (Vdbe *)0x0) {
      *(int *)&v->db = in_R8D;
    }
    if (((*(uint *)(in_RSI + 0x40) & 0x20) == 0) &&
       ((in_R9 == (Parse *)0x0 || (*(char *)&in_R9->db != '\0')))) {
      sqlite3OpenTable(in_R9,in_stack_ffffffffffffffcc,iDb_00,
                       (Table *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),iVar1);
    }
    else {
      sqlite3TableLock((Parse *)CONCAT44(in_EDX,uVar2),iDb_01,in_stack_ffffffffffffffd8,
                       (u8)((ulong)in_R9 >> 0x38),(char *)CONCAT44(in_stack_ffffffffffffffcc,iDb_00)
                      );
    }
    if (pIdx != (Index *)0x0) {
      *(int *)&pIdx->zName = iDb_01;
    }
    local_4 = 0;
    for (pIdx_00 = *(Index **)(in_RSI + 0x10); pIdx_00 != (Index *)0x0; pIdx_00 = pIdx_00->pNext) {
      iVar1 = iDb_01 + 1;
      if (((*(ushort *)&pIdx_00->field_0x63 & 3) == 2) && ((*(uint *)(in_RSI + 0x40) & 0x20) != 0))
      {
        if (v != (Vdbe *)0x0) {
          *(int *)&v->db = iDb_01;
        }
        uVar2 = 0;
      }
      if ((in_R9 == (Parse *)0x0) || (*(char *)((long)&in_R9->db + (long)(local_4 + 1)) != '\0')) {
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(local_4,iDb_00),in_R8D,in_stack_ffffffffffffffc0,
                          (int)((ulong)pIdx_00 >> 0x20),(int)pIdx_00);
        sqlite3VdbeSetP4KeyInfo((Parse *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),pIdx_00);
        sqlite3VdbeChangeP5(p,(ushort)(byte)((uint)uVar2 >> 0x18));
      }
      local_4 = local_4 + 1;
      iDb_01 = iVar1;
    }
    if (*(int *)((long)in_RDI + 0x34) < iDb_01) {
      *(int *)((long)in_RDI + 0x34) = iDb_01;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int op,          /* OP_OpenRead or OP_OpenWrite */
  u8 p5,           /* P5 value for OP_Open* opcodes (except on WITHOUT ROWID) */
  int iBase,       /* Use this for the table cursor, if there is one */
  u8 *aToOpen,     /* If not NULL: boolean for each table and index */
  int *piDataCur,  /* Write the database source cursor number here */
  int *piIdxCur    /* Write the first index cursor number here */
){
  int i;
  int iDb;
  int iDataCur;
  Index *pIdx;
  Vdbe *v;

  assert( op==OP_OpenRead || op==OP_OpenWrite );
  assert( op==OP_OpenWrite || p5==0 );
  if( IsVirtual(pTab) ){
    /* This routine is a no-op for virtual tables. Leave the output
    ** variables *piDataCur and *piIdxCur uninitialized so that valgrind
    ** can detect if they are used by mistake in the caller. */
    return 0;
  }
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  if( iBase<0 ) iBase = pParse->nTab;
  iDataCur = iBase++;
  if( piDataCur ) *piDataCur = iDataCur;
  if( HasRowid(pTab) && (aToOpen==0 || aToOpen[0]) ){
    sqlite3OpenTable(pParse, iDataCur, iDb, pTab, op);
  }else{
    sqlite3TableLock(pParse, iDb, pTab->tnum, op==OP_OpenWrite, pTab->zName);
  }
  if( piIdxCur ) *piIdxCur = iBase;
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    int iIdxCur = iBase++;
    assert( pIdx->pSchema==pTab->pSchema );
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      if( piDataCur ) *piDataCur = iIdxCur;
      p5 = 0;
    }
    if( aToOpen==0 || aToOpen[i+1] ){
      sqlite3VdbeAddOp3(v, op, iIdxCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      sqlite3VdbeChangeP5(v, p5);
      VdbeComment((v, "%s", pIdx->zName));
    }
  }
  if( iBase>pParse->nTab ) pParse->nTab = iBase;
  return i;
}